

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getSizeLayerString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,IVec2 *size,int numLayers)

{
  int iVar1;
  ostream *poVar2;
  ostringstream local_198 [8];
  ostringstream str;
  int numLayers_local;
  IVec2 *size_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  iVar1 = tcu::Vector<int,_2>::x((Vector<int,_2> *)this);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,iVar1);
  poVar2 = std::operator<<(poVar2,"x");
  iVar1 = tcu::Vector<int,_2>::y((Vector<int,_2> *)this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"_");
  std::ostream::operator<<(poVar2,(int)size);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string getSizeLayerString (const IVec2& size, const int numLayers)
{
	std::ostringstream str;
	str << size.x() << "x" << size.y() << "_" << numLayers;
	return str.str();
}